

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O0

int PDFObjectParserTest(int argc,char **argv)

{
  bool bVar1;
  EStatusCode EVar2;
  PDFObjectParser *objectParser;
  ostream *poVar3;
  PDFObjectParser *pObjectParser;
  PDFParser parser;
  allocator<char> local_91;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  PDFObjectParserTestLogHelper log;
  int failures;
  char **argv_local;
  int argc_local;
  
  log.mOutput.mFileStream._4_4_ = 0;
  PDFObjectParserTestLogHelper::PDFObjectParserTestLogHelper
            ((PDFObjectParserTestLogHelper *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"PDFObjectParserTest.txt",&local_91);
  BuildRelativeOutputPath(&local_70,argv,&local_90);
  EVar2 = PDFObjectParserTestLogHelper::openLog((PDFObjectParserTestLogHelper *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (EVar2 == eSuccess) {
    PDFParser::PDFParser((PDFParser *)&pObjectParser);
    objectParser = PDFParser::GetObjectParser((PDFParser *)&pObjectParser);
    EVar2 = ParseCommentedTokens(objectParser,(PDFObjectParserTestLogHelper *)local_50);
    if (EVar2 == eFailure) {
      log.mOutput.mFileStream._4_4_ = log.mOutput.mFileStream._4_4_ + 1;
    }
    EVar2 = ParseHexStringTokens(objectParser,(PDFObjectParserTestLogHelper *)local_50);
    if (EVar2 == eFailure) {
      log.mOutput.mFileStream._4_4_ = log.mOutput.mFileStream._4_4_ + 1;
    }
    EVar2 = ParseLiteralStringTokens(objectParser,(PDFObjectParserTestLogHelper *)local_50);
    if (EVar2 == eFailure) {
      log.mOutput.mFileStream._4_4_ = log.mOutput.mFileStream._4_4_ + 1;
    }
    bVar1 = 0 < log.mOutput.mFileStream._4_4_;
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed tests in PDFObjectParserTest: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,log.mOutput.mFileStream._4_4_);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = (uint)bVar1;
    parser.mAllowExtendingSegments = true;
    parser._1609_3_ = 0;
    PDFParser::~PDFParser((PDFParser *)&pObjectParser);
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to initialize log output\n");
    argv_local._4_4_ = 0xffffffff;
    parser.mAllowExtendingSegments = true;
    parser._1609_3_ = 0;
  }
  PDFObjectParserTestLogHelper::~PDFObjectParserTestLogHelper
            ((PDFObjectParserTestLogHelper *)local_50);
  return argv_local._4_4_;
}

Assistant:

int PDFObjectParserTest(int argc, char* argv[])
{
	int failures = 0;
	PDFObjectParserTestLogHelper log;
	if (log.openLog(BuildRelativeOutputPath(argv, "PDFObjectParserTest.txt")) != eSuccess){
		cout << "failed to initialize log output\n";
		return eFailure;
	}


	PDFParser parser;
	PDFObjectParser*  pObjectParser = &parser.GetObjectParser();

	if (ParseCommentedTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseHexStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseLiteralStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}



	if (failures > 0){
		cout << "Failed tests in PDFObjectParserTest: " << failures << endl;
		return 1;
	}
	return 0;
}